

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowCollapsed(char *name,bool collapsed,ImGuiCond cond)

{
  ImGuiWindow *window_00;
  ImGuiWindow *window;
  ImGuiCond cond_local;
  bool collapsed_local;
  char *name_local;
  
  window_00 = FindWindowByName(name);
  if (window_00 != (ImGuiWindow *)0x0) {
    ::SetWindowCollapsed(window_00,collapsed,cond);
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(const char* name, bool collapsed, ImGuiCond cond)
{
    if (ImGuiWindow* window = FindWindowByName(name))
        SetWindowCollapsed(window, collapsed, cond);
}